

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture2.c
# Opt level: O3

ktx_uint32_t ktxTexture2_calcPostInflationLevelAlignment(ktxTexture2 *This)

{
  ulong uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  
  if (KTX_SS_BASIS_LZ < This->supercompressionScheme) {
    if (This->vkFormat == 0) {
      uVar2 = 0x10;
    }
    else {
      uVar4 = (This->_protected->_formatSize).blockSizeInBits;
      uVar2 = uVar4 >> 3;
      if ((uVar4 & 0x18) != 0) {
        uVar1 = 4;
        uVar4 = uVar2;
        do {
          uVar3 = uVar4;
          uVar4 = (uint)(uVar1 % (ulong)uVar3);
          uVar1 = (ulong)uVar3;
        } while (uVar4 != 0);
        uVar2 = (uVar2 << 2) / uVar3;
      }
    }
    return uVar2;
  }
  __assert_fail("This->supercompressionScheme != KTX_SS_NONE && This->supercompressionScheme != KTX_SS_BASIS_LZ"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/texture2.c"
                ,0x6d5,"ktx_uint32_t ktxTexture2_calcPostInflationLevelAlignment(ktxTexture2 *)");
}

Assistant:

ktx_uint32_t
ktxTexture2_calcPostInflationLevelAlignment(ktxTexture2* This)
{
    ktx_uint32_t alignment;

    // Should actually work for none supercompressed but don't want to
    // encourage use of it.
    assert(This->supercompressionScheme != KTX_SS_NONE && This->supercompressionScheme != KTX_SS_BASIS_LZ);

    if (This->vkFormat != VK_FORMAT_UNDEFINED)
        alignment = lcm4(This->_protected->_formatSize.blockSizeInBits / 8);
    else
        alignment = 16;

    return alignment;
}